

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffd0;
  int n;
  
  n = 0;
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  fmt_helper::pad2(n,in_stack_ffffffffffffffd0);
  uVar2 = 0x2f;
  ::fmt::v8::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT13(0x2f,CONCAT12(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
             in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,in_stack_ffffffffffffffd0);
  uVar1 = 0x2f;
  ::fmt::v8::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT13(uVar2,CONCAT12(0x2f,in_stack_ffffffffffffffa0))),
             in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,in_stack_ffffffffffffffd0);
  scoped_padder::~scoped_padder
            ((scoped_padder *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT13(uVar2,CONCAT12(uVar1,in_stack_ffffffffffffffa0))));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }